

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O3

textblock * effect_describe(effect *e,char *prefix,int dev_skill_boost,_Bool only_first)

{
  ushort uVar1;
  uint16_t uVar2;
  dice_t *dice;
  bool bVar3;
  bool bVar4;
  random_value value_00;
  int iVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  textblock *tb;
  textblock *ptVar11;
  obj_property *poVar12;
  wchar_t wVar13;
  undefined7 in_register_00000009;
  undefined8 uVar14;
  bool bVar15;
  effect *peVar16;
  int iVar17;
  char *pcVar18;
  int iVar19;
  char cVar20;
  ulong uVar21;
  uint uVar22;
  random_value value_01;
  random_value value;
  random_value first_rv;
  char dice_string [20];
  char desc [250];
  random_value this_rv;
  char dice_string_1 [20];
  char breaths [120];
  effect *local_338;
  int local_32c;
  uint local_328;
  textblock *local_310;
  undefined1 local_308 [8];
  undefined8 uStack_300;
  int local_2f8;
  uint local_2f4;
  char *local_2f0;
  random_value local_2e8;
  char local_2d8 [24];
  char *local_2c0;
  uint local_2b4;
  wchar_t local_2b0;
  uint local_2ac;
  dice_t *local_2a8;
  char *local_2a0;
  char local_298 [256];
  random_value local_198 [13];
  undefined1 local_c8 [32];
  char local_a8 [120];
  
  pcVar10 = (char *)CONCAT71(in_register_00000009,only_first);
  local_308 = (undefined1  [8])0x0;
  uStack_300 = (char *)0x0;
  if (e == (effect *)0x0) {
    local_310 = (textblock *)0x0;
  }
  else {
    uVar21 = (ulong)pcVar10 & 0xffffffff;
    local_310 = (textblock *)0x0;
    local_2f8 = 0;
    bVar15 = false;
    local_2c0 = prefix;
    do {
      pcVar9 = effect_desc(e);
      uVar1 = e->index;
      uVar22 = (uint)uVar1;
      if (uVar1 == 0x6d) {
        if (e->dice == (dice_t *)0x0) {
          __assert_fail("e->dice != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects-info.c"
                        ,0x157,
                        "textblock *effect_describe(const struct effect *, const char *, int, _Bool)"
                       );
        }
        dice_roll(e->dice,(random_value *)local_308);
        e = e->next;
        bVar15 = true;
        goto LAB_00142197;
      }
      if (uVar1 == 0x6e) {
        if (!bVar15) {
          __assert_fail("value_set",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects-info.c"
                        ,0x14f,
                        "textblock *effect_describe(const struct effect *, const char *, int, _Bool)"
                       );
        }
        bVar15 = false;
        e = e->next;
        goto LAB_00142197;
      }
      local_32c = 0;
      if ((e->dice != (dice_t *)0x0) && (!bVar15)) {
        local_32c = dice_roll(e->dice,(random_value *)local_308);
        uVar22 = (uint)e->index;
      }
      cVar20 = (char)uVar21;
      if (((short)uVar22 == 0x6c) || (uVar22 == 1)) {
        pcVar9 = (char *)0x0;
        if (local_2f8 == 0) {
          pcVar9 = prefix;
        }
        pcVar18 = (char *)0x0;
        if ((short)uVar22 == 1) {
          pcVar18 = "randomly ";
        }
        e = e->next;
        local_2e8.base = 0;
        local_2e8.dice = 0;
        local_2e8.sides = 0;
        local_2e8.m_bonus = 0;
        pcVar10 = (char *)CONCAT71((int7)((ulong)pcVar10 >> 8),0 < local_32c && e != (effect *)0x0);
        if (0 < local_32c && e != (effect *)0x0) {
          iVar17 = 2;
          iVar19 = 1;
          local_2f0 = pcVar9;
          local_2ac = uVar22;
          local_2a0 = pcVar18;
LAB_00142144:
          pcVar9 = effect_desc(e);
          if (((pcVar9 != (char *)0x0) && (uVar1 = e->index, uVar1 != 0x6c)) && (uVar1 != 1)) {
            local_2f4 = (uint)uVar1;
            local_2b0 = e->other;
            dice = e->dice;
            if (dice != (dice_t *)0x0) {
              dice_random_value(dice,&local_2e8);
            }
            local_2b4 = (uint)uVar21;
            local_338 = e->next;
            if (iVar19 < local_32c && local_338 != (effect *)0x0) {
              bVar7 = true;
              iVar8 = 1;
              bVar6 = true;
              bVar3 = true;
              local_2a8 = dice;
              iVar5 = iVar17;
              do {
                pcVar10 = effect_desc(local_338);
                if (((pcVar10 != (char *)0x0) && (uVar2 = local_338->index, uVar2 != 1)) &&
                   (uVar2 != 0x6c)) {
                  iVar8 = iVar8 + 1;
                  bVar3 = (bool)(uVar2 == (uint16_t)local_2f4 & bVar3);
                  bVar6 = (bool)(local_338->other == local_2b0 & bVar6);
                  if (local_338->dice == (dice_t *)0x0) {
                    bVar7 = (bool)(local_2a8 == (dice_t *)0x0 & bVar7);
                  }
                  else if (local_2a8 == (dice_t *)0x0) {
                    bVar7 = false;
                  }
                  else {
                    dice_random_value(local_338->dice,local_198);
                    if (((local_198[0].base != local_2e8.base) ||
                        (local_198[0].dice != local_2e8.dice)) ||
                       ((local_198[0].sides != local_2e8.sides ||
                        (local_198[0].m_bonus != local_2e8.m_bonus)))) {
                      bVar7 = false;
                    }
                  }
                }
                local_338 = local_338->next;
              } while ((local_338 != (effect *)0x0) &&
                      (bVar4 = iVar5 < local_32c, iVar5 = iVar5 + 1, bVar4));
            }
            else {
              iVar8 = 1;
              bVar3 = true;
              bVar6 = true;
              bVar7 = true;
            }
            if ((((((ushort)local_2f4 & 0xfffe) == 0x48) && (bVar3)) && (bVar7)) && (bVar6)) {
              pcVar10 = projections[e->subtype].player_desc;
              strnfmt(local_a8,0x78,"%s");
              peVar16 = e->next;
              if (peVar16 != (effect *)0x0 && iVar19 < local_32c) {
                pcVar10 = (char *)(ulong)(iVar8 - 1U);
                pcVar9 = " or ";
                if (2 < iVar8) {
                  pcVar9 = ", or ";
                }
                uVar22 = 1;
                do {
                  pcVar18 = effect_desc(peVar16);
                  if (((pcVar18 != (char *)0x0) && (peVar16->index != 1)) &&
                     (peVar16->index != 0x6c)) {
                    pcVar10 = ", ";
                    if (uVar22 == iVar8 - 1U) {
                      pcVar10 = pcVar9;
                    }
                    my_strcat(local_a8,pcVar10,0x78);
                    pcVar10 = (char *)((long)peVar16->subtype * 0x68);
                    my_strcat(local_a8,projections[peVar16->subtype].player_desc,0x78);
                    uVar22 = uVar22 + 1;
                  }
                  peVar16 = peVar16->next;
                } while ((peVar16 != (effect *)0x0) &&
                        (bVar3 = iVar17 < local_32c, iVar17 = iVar17 + 1, bVar3));
              }
              format_dice_string(&local_2e8,1,(size_t)local_c8,pcVar10);
              pcVar10 = effect_desc(e);
              strnfmt((char *)local_198,200,pcVar10,local_a8,(ulong)(uint)e->other,local_c8);
              iVar19 = dev_skill_boost;
              if (e->index == 0x48) {
                iVar19 = 0;
              }
              pcVar10 = (char *)CONCAT44(local_2e8.m_bonus,local_2e8.sides);
              value_00.dice = local_2e8.dice;
              value_00.base = local_2e8.base;
              value_00.sides = local_2e8.sides;
              value_00.m_bonus = local_2e8.m_bonus;
              append_damage((char *)local_198,200,value_00,iVar19);
              tb = textblock_new();
              if (local_2f0 != (char *)0x0) {
                textblock_append(tb,"%s");
              }
              if ((short)local_2ac == 1) {
                textblock_append(tb,"%s","randomly ");
              }
              copy_to_textblock_with_coloring(tb,(char *)local_198);
            }
            else {
              uVar14 = 0;
              ptVar11 = effect_describe(e,local_2a0,dev_skill_boost,true);
              pcVar10 = local_2f0;
              if (ptVar11 == (textblock *)0x0) {
                iVar8 = iVar8 + -1;
                tb = (textblock *)0x0;
                local_328 = 0;
              }
              else {
                local_328 = 1;
                tb = ptVar11;
                if (local_2f0 != (char *)0x0) {
                  tb = textblock_new();
                  textblock_append(tb,"%s",pcVar10);
                  textblock_append_textblock(tb,ptVar11);
                  textblock_free(ptVar11);
                }
              }
              peVar16 = e->next;
              pcVar10 = (char *)CONCAT71((int7)((ulong)uVar14 >> 8),
                                         peVar16 != (effect *)0x0 && iVar19 < local_32c);
              if (peVar16 != (effect *)0x0 && iVar19 < local_32c) {
                do {
                  pcVar9 = effect_desc(peVar16);
                  if (((pcVar9 != (char *)0x0) && (peVar16->index != 1)) && (peVar16->index != 0x6c)
                     ) {
                    pcVar9 = (char *)0x0;
                    if (local_328 == 0) {
                      pcVar9 = local_2a0;
                    }
                    pcVar10 = (char *)0x1;
                    ptVar11 = effect_describe(peVar16,pcVar9,dev_skill_boost,true);
                    if (ptVar11 == (textblock *)0x0) {
                      iVar8 = iVar8 + -1;
                    }
                    else {
                      if ((local_2f0 == (char *)0x0) || (tb != (textblock *)0x0)) {
                        if (tb != (textblock *)0x0) {
                          pcVar10 = (char *)(ulong)local_328;
                          if (0 < (int)local_328) {
                            pcVar9 = ", ";
                            if (local_328 == iVar8 - 1U) {
                              pcVar9 = " or ";
                            }
                            textblock_append(tb,pcVar9);
                          }
                          goto LAB_00142749;
                        }
                      }
                      else {
                        if (local_328 != 0) {
                          __assert_fail("ivalid == 0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects-info.c"
                                        ,0x11e,
                                        "textblock *create_nested_effect_description(const struct effect *, int, const char *, const char *, int, const struct effect **)"
                                       );
                        }
                        tb = textblock_new();
                        textblock_append(tb,"%s",local_2f0);
                        if (tb != (textblock *)0x0) {
LAB_00142749:
                          textblock_append_textblock(tb,ptVar11);
                          textblock_free(ptVar11);
                          ptVar11 = tb;
                        }
                      }
                      local_328 = local_328 + 1;
                      tb = ptVar11;
                    }
                  }
                  peVar16 = peVar16->next;
                } while ((peVar16 != (effect *)0x0) &&
                        (bVar3 = iVar17 < local_32c, iVar17 = iVar17 + 1, bVar3));
              }
            }
            uVar22 = local_2b4;
            prefix = local_2c0;
            if ((char)local_2b4 != '\0') {
              local_338 = (effect *)0x0;
            }
            if (tb != (textblock *)0x0) {
              if (local_310 != (textblock *)0x0) {
                pcVar9 = ", ";
                if (local_338 == (effect *)0x0) {
                  pcVar9 = " and ";
                }
                textblock_append(local_310,pcVar9);
                textblock_append_textblock(local_310,tb);
                textblock_free(tb);
                tb = local_310;
              }
              local_310 = tb;
              local_2f8 = local_2f8 + 1;
            }
            uVar21 = (ulong)uVar22;
            e = local_338;
            goto LAB_00142197;
          }
          e = e->next;
          if (e != (effect *)0x0) goto code_r0x0014216e;
        }
LAB_0014217a:
        prefix = local_2c0;
        if (cVar20 != '\0') {
          return local_310;
        }
        goto LAB_00142197;
      }
      if (pcVar9 == (char *)0x0) {
        if (cVar20 != '\0') {
          return local_310;
        }
        e = e->next;
        goto LAB_00142197;
      }
      format_dice_string((random_value *)local_308,1,(size_t)local_2d8,pcVar10);
      iVar19 = dev_skill_boost;
      switch(base_descs[e->index].efinfo_flag) {
      case 0:
        pcVar10 = pcVar9;
        pcVar9 = "%s";
        goto LAB_00142b67;
      case 1:
        pcVar10 = local_2d8;
        goto LAB_00142b67;
      case 2:
        if (uStack_300._4_4_ == 0) {
          strnfmt((char *)local_198,0x32,"%s","");
        }
        else {
          strnfmt((char *)local_198,0x32," (or %d%%, whichever is greater)");
        }
        pcVar10 = local_2d8;
        goto LAB_00142c84;
      case 3:
        wVar13 = (int)local_308._0_4_ / 2;
        goto LAB_00142af4;
      case 4:
        pcVar10 = "leaves you nourished";
        if (e->subtype == L'\x01') {
          pcVar10 = "uses enough food value";
        }
        if (e->subtype == L'\0') {
          pcVar10 = "feeds you";
        }
        format_dice_string((random_value *)local_308,(uint)z_info->food_value,(size_t)local_198,
                           "uses enough food value");
        strnfmt(local_298,0xfa,pcVar9,pcVar10,local_198,local_2d8);
        break;
      case 5:
        pcVar10 = timed_effects[e->subtype].desc;
        goto LAB_00142b67;
      case 6:
        pcVar10 = timed_effects[e->subtype].desc;
        strnfmt(local_298,0xfa,pcVar9,pcVar10,local_2d8);
        break;
      case 7:
        poVar12 = lookup_obj_property(1,e->subtype);
        pcVar10 = poVar12->name;
        goto LAB_00142b67;
      case 8:
      case 0x11:
      case 0x13:
        pcVar10 = projections[e->subtype].desc;
        goto LAB_00142b67;
      case 9:
        pcVar10 = summon_desc(e->subtype);
LAB_00142b67:
        strnfmt(local_298,0xfa,pcVar9);
        break;
      case 10:
        if (uStack_300._4_4_ == 0) {
          strnfmt((char *)local_198,0x20,"%d grids",(ulong)local_308 & 0xffffffff);
        }
        else {
          strnfmt((char *)local_198,0x20,"a level-dependent distance");
        }
        pcVar10 = "a monster";
        if (e->subtype == L'\0') {
          pcVar10 = "you";
        }
LAB_00142c84:
        strnfmt(local_298,0xfa,pcVar9,pcVar10,local_198);
        break;
      case 0xb:
        wVar13 = e->radius;
LAB_00142af4:
        pcVar10 = (char *)(ulong)(uint)wVar13;
        strnfmt(local_298,0xfa,pcVar9);
        break;
      case 0xc:
        strnfmt(local_298,0xfa,pcVar9,projections[e->subtype].player_desc,(ulong)(uint)e->radius,
                local_2d8);
        goto LAB_00142c05;
      case 0xd:
        wVar13 = e->other;
        if (e->other == L'\0') {
          wVar13 = e->radius;
        }
        strnfmt(local_298,0xfa,pcVar9,projections[e->subtype].player_desc,(ulong)(uint)e->radius,
                (ulong)(uint)wVar13,local_2d8);
        goto LAB_00142c05;
      case 0xe:
        strnfmt(local_298,0xfa,pcVar9,projections[e->subtype].player_desc,(ulong)(uint)e->other,
                local_2d8);
        if (e->index == 0x48) {
          iVar19 = 0;
        }
        goto LAB_00142c05;
      case 0xf:
        pcVar10 = projections[e->subtype].player_desc;
        if (e->other == L'\0') {
          iVar19 = 0;
        }
        else {
          iVar19 = (int)player->lev / e->other;
        }
        strnfmt(local_298,0xfa,pcVar9,pcVar10,(ulong)(uint)(iVar19 + e->radius),local_2d8);
        break;
      case 0x10:
        pcVar10 = projections[e->subtype].lash_desc;
        strnfmt(local_298,0xfa,pcVar9);
        break;
      case 0x12:
        strnfmt(local_298,0xfa,pcVar9,projections[e->subtype].desc,local_2d8);
LAB_00142c05:
        value_01._8_8_ = uStack_300;
        value_01.base = local_308._0_4_;
        value_01.dice = local_308._4_4_;
        pcVar10 = uStack_300;
        append_damage(local_298,0xfa,value_01,iVar19);
        break;
      default:
        pcVar10 = "";
        strnfmt(local_298,0xfa,"%s");
        msg("Bad effect description passed to effect_info().  Please report this bug.");
      }
      if (cVar20 == '\0') {
        e = e->next;
      }
      else {
        e = (effect *)0x0;
      }
      if (local_298[0] != '\0') {
        if (local_310 == (textblock *)0x0) {
          local_310 = textblock_new();
          if (prefix != (char *)0x0) {
            textblock_append(local_310,"%s",prefix);
          }
        }
        else {
          if (e == (effect *)0x0) {
            pcVar9 = " and ";
          }
          else {
            pcVar9 = ", ";
          }
          textblock_append(local_310,pcVar9);
        }
        copy_to_textblock_with_coloring(local_310,local_298);
        local_2f8 = local_2f8 + 1;
      }
LAB_00142197:
    } while (e != (effect *)0x0);
  }
  return local_310;
code_r0x0014216e:
  iVar17 = iVar17 + 1;
  bVar3 = local_32c <= iVar19;
  iVar19 = iVar19 + 1;
  if (bVar3) goto LAB_0014217a;
  goto LAB_00142144;
}

Assistant:

textblock *effect_describe(const struct effect *e, const char *prefix,
	int dev_skill_boost, bool only_first)
{
	textblock *tb = NULL;
	int nadded = 0;
	char desc[250];
	random_value value = { 0, 0, 0, 0 };
	bool value_set = false;

	while (e) {
		const char* edesc = effect_desc(e);
		int roll = 0;
		char dice_string[20];

		/* Deal with special clear value effect. */
		if (e->index == EF_CLEAR_VALUE) {
			assert(value_set);
			value_set = false;
			e = e->next;
			continue;
		}

		/* Deal with special set value effect. */
		if (e->index == EF_SET_VALUE) {
			assert(e->dice != NULL);
			roll = dice_roll(e->dice, &value);
			value_set = true;
			e = e->next;
			continue;
		}

		if ((e->dice != NULL) && !value_set) {
			roll = dice_roll(e->dice, &value);
		}

		/* Deal with special random or select effects. */
		if (e->index == EF_RANDOM || e->index == EF_SELECT) {
			const struct effect *nexte;
			textblock *tbe = create_nested_effect_description(
				e->next, roll, (nadded == 0) ? prefix : NULL,
				(e->index == EF_RANDOM) ? "randomly " : NULL,
				dev_skill_boost, &nexte);

			e = (only_first) ? NULL : nexte;
			if (tbe) {
				if (tb) {
					textblock_append(tb,
						e ? ", " : " and ");
					textblock_append_textblock(tb, tbe);
					textblock_free(tbe);
				} else {
					tb = tbe;
				}
				++nadded;
			}
			continue;
		}

		if (!edesc) {
			e = (only_first) ? NULL : e->next;
			continue;
		}

		format_dice_string(&value, 1, sizeof(dice_string), dice_string);

		/* Check all the possible types of description format. */
		switch (base_descs[e->index].efinfo_flag) {
		case EFINFO_DICE:
			strnfmt(desc, sizeof(desc), edesc, dice_string);
			break;

		case EFINFO_HEAL:
			/* Healing sometimes has a minimum percentage. */
			{
				char min_string[50];

				if (value.m_bonus) {
					strnfmt(min_string, sizeof(min_string),
						" (or %d%%, whichever is greater)",
						value.m_bonus);
				} else {
					strnfmt(min_string, sizeof(min_string),
						"%s", "");
				}
				strnfmt(desc, sizeof(desc), edesc, dice_string,
					min_string);
			}
			break;

		case EFINFO_CONST:
			strnfmt(desc, sizeof(desc), edesc, value.base / 2);
			break;

		case EFINFO_FOOD:
			{
				const char *fed = e->subtype ?
					(e->subtype == 1 ? "uses enough food value" : 
					 "leaves you nourished") : "feeds you";
				char turn_dice_string[20];

				format_dice_string(&value, z_info->food_value,
					sizeof(turn_dice_string),
					turn_dice_string);

				strnfmt(desc, sizeof(desc), edesc, fed,
					turn_dice_string, dice_string);
			}
			break;

		case EFINFO_CURE:
			strnfmt(desc, sizeof(desc), edesc,
				timed_effects[e->subtype].desc);
			break;

		case EFINFO_TIMED:
			strnfmt(desc, sizeof(desc), edesc,
				timed_effects[e->subtype].desc,
				dice_string);
			break;

		case EFINFO_STAT:
			{
				int stat = e->subtype;

				strnfmt(desc, sizeof(desc), edesc,
					lookup_obj_property(OBJ_PROPERTY_STAT, stat)->name);
			}
			break;

		case EFINFO_SEEN:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].desc);
			break;

		case EFINFO_SUMM:
			strnfmt(desc, sizeof(desc), edesc,
				summon_desc(e->subtype));
			break;

		case EFINFO_TELE:
			/*
			 * Only currently used for the player, but can handle
			 * monsters.
			 */
			{
				char dist[32];

				if (value.m_bonus) {
					strnfmt(dist, sizeof(dist),
						"a level-dependent distance");
				} else {
					strnfmt(dist, sizeof(dist),
						"%d grids", value.base);
				}
				strnfmt(desc, sizeof(desc), edesc,
					(e->subtype) ? "a monster" : "you",
					dist);
			}
			break;

		case EFINFO_QUAKE:
			strnfmt(desc, sizeof(desc), edesc, e->radius);
			break;

		case EFINFO_BALL:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].player_desc,
				e->radius, dice_string);
			append_damage(desc, sizeof(desc), value, dev_skill_boost);
			break;

		case EFINFO_SPOT:
			{
				int i_radius = e->other ? e->other : e->radius;

				strnfmt(desc, sizeof(desc), edesc,
					projections[e->subtype].player_desc,
					e->radius, i_radius, dice_string);
				append_damage(desc, sizeof(desc), value, dev_skill_boost);
			}
			break;

		case EFINFO_BREATH:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].player_desc, e->other,
				dice_string);
			append_damage(desc, sizeof(desc), value,
				e->index == EF_BREATH ? 0 : dev_skill_boost);
			break;

		case EFINFO_SHORT:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].player_desc,
				e->radius +
					(e->other ? player->lev / e->other : 0),
				dice_string);
			break;

		case EFINFO_LASH:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].lash_desc, e->subtype);
			break;

		case EFINFO_BOLT:
			/* Bolt that inflict status */
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].desc);
			break;

		case EFINFO_BOLTD:
			/* Bolts and beams that damage */
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].desc, dice_string);
			append_damage(desc, sizeof(desc), value, dev_skill_boost);
			break;

		case EFINFO_TOUCH:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].desc);
			break;

		case EFINFO_NONE:
			strnfmt(desc, sizeof(desc), "%s", edesc);
			break;

		default:
			strnfmt(desc, sizeof(desc), "%s", "");
			msg("Bad effect description passed to effect_info().  Please report this bug.");
			break;
		}

		e = (only_first) ? NULL : e->next;

		if (desc[0] != '\0') {
			if (tb) {
				if (e) {
					textblock_append(tb, ", ");
				} else {
					textblock_append(tb, " and ");
				}
			} else {
				tb = textblock_new();
				if (prefix) {
					textblock_append(tb, "%s", prefix);
				}
			}
			copy_to_textblock_with_coloring(tb, desc);

			++nadded;
		}
	}

	return tb;
}